

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskFileIndex.cpp
# Opt level: O0

void __thiscall OnDiskFileIndex::generate_namecache_file(OnDiskFileIndex *this)

{
  string_view_t fmt;
  string_view_t fmt_00;
  path *in_RDI;
  uint64_t count;
  uint64_t offset;
  ofstream of;
  char *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  path *this_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  path *in_stack_fffffffffffffd10;
  path *in_stack_fffffffffffffd18;
  undefined8 local_2b0 [19];
  long local_218 [58];
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffffb8;
  OnDiskFileIndex *in_stack_ffffffffffffffc0;
  
  ::fmt::v6::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  fmt.size_ = (size_t)in_stack_fffffffffffffd00;
  fmt.data_ = (char *)in_RDI;
  spdlog::debug<std::__cxx11::string>(fmt,in_stack_fffffffffffffcf0);
  std::ofstream::ofstream(local_218);
  std::ios::exceptions((int)local_218 + (int)*(undefined8 *)(local_218[0] + -0x18));
  this_00 = (path *)&(in_RDI->_M_pathname)._M_string_length;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::experimental::filesystem::v1::__cxx11::operator/
            (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::basic_ofstream<char,_std::char_traits<char>_>::
  open<std::experimental::filesystem::v1::__cxx11::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd00,in_RDI,
             (openmode)((ulong)this_00 >> 0x20));
  std::experimental::filesystem::v1::__cxx11::path::~path(this_00);
  std::experimental::filesystem::v1::__cxx11::path::~path(this_00);
  local_2b0[0] = 0;
  std::function<void(std::__cxx11::string_const&)>::
  function<OnDiskFileIndex::generate_namecache_file()::__0,void>
            (in_stack_fffffffffffffd00,(anon_class_24_3_62655ada *)in_RDI);
  for_each_filename(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x19d687);
  *(undefined8 *)&in_RDI->_M_pathname = 0;
  std::ostream::write((char *)local_218,(long)local_2b0);
  std::ostream::flush();
  ::fmt::v6::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)this_00,in_stack_fffffffffffffce8);
  fmt_00.size_ = (size_t)in_stack_fffffffffffffd00;
  fmt_00.data_ = (char *)in_RDI;
  spdlog::info<std::__cxx11::string>(fmt_00,&this_00->_M_pathname);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void OnDiskFileIndex::generate_namecache_file() {
    spdlog::debug("Namecache {} not found, generating", cache_fname);

    std::ofstream of;
    of.exceptions(std::ofstream::badbit);
    of.open(db_base / cache_fname, std::ofstream::binary);

    uint64_t offset = 0;
    uint64_t count = 0;
    for_each_filename([&of, &offset, &count](const std::string &fname) {
        of.write(reinterpret_cast<char *>(&offset), sizeof(offset));
        offset += fname.size() + 1;
        count += 1;
    });
    file_count = count;
    of.write(reinterpret_cast<char *>(&offset), sizeof(offset));
    of.flush();
    spdlog::info("SAVE: {}", cache_fname);
}